

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

void preprocess_signed(aec_stream *strm)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  internal_state *piVar4;
  uint *puVar5;
  uint32_t *puVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint uVar10;
  uint uVar11;
  
  piVar4 = strm->state;
  puVar5 = piVar4->data_raw;
  puVar6 = piVar4->data_pp;
  uVar1 = piVar4->xmin;
  uVar2 = piVar4->xmax;
  uVar10 = strm->block_size * strm->rsi - 1;
  uVar11 = strm->bits_per_sample;
  piVar4->ref = 1;
  piVar4->ref_sample = *puVar5;
  *puVar6 = 0;
  uVar11 = (uint)(1L << ((char)uVar11 - 1U & 0x3f));
  *puVar5 = (*puVar5 ^ uVar11) - uVar11;
  if (uVar10 != 0) {
    uVar7 = 0;
    do {
      uVar8 = (puVar5[uVar7 + 1] ^ uVar11) - uVar11;
      puVar5[uVar7 + 1] = uVar8;
      uVar3 = puVar5[uVar7];
      if ((int)uVar8 < (int)uVar3) {
        if (uVar2 - uVar3 < uVar3 - uVar8) {
          uVar9 = uVar2 - uVar8;
          goto LAB_0010155c;
        }
        uVar9 = (uVar3 - uVar8) * 2 - 1;
LAB_00101554:
        puVar6[uVar7 + 1] = uVar9;
      }
      else {
        if (uVar3 - uVar1 < uVar8 - uVar3) {
          uVar9 = uVar8 - uVar1;
          goto LAB_00101554;
        }
        uVar9 = (uVar8 - uVar3) * 2;
LAB_0010155c:
        puVar6[uVar7 + 1] = uVar9;
      }
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  piVar4->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
  return;
}

Assistant:

static void preprocess_signed(struct aec_stream *strm)
{
    /**
       Preprocess RSI of signed samples.
    */

    uint32_t D;
    struct internal_state *state = strm->state;
    int32_t *restrict x = (int32_t *)state->data_raw;
    uint32_t *restrict d = state->data_pp;
    int32_t xmax = (int32_t)state->xmax;
    int32_t xmin = (int32_t)state->xmin;
    uint32_t rsi = strm->rsi * strm->block_size - 1;
    uint32_t m = UINT64_C(1) << (strm->bits_per_sample - 1);
    size_t i;

    state->ref = 1;
    state->ref_sample = x[0];
    d[0] = 0;
    x[0] = (x[0] ^ m) - m;

    for (i = 0; i < rsi; i++) {
        x[i + 1] = (x[i + 1] ^ m) - m;
        if (x[i + 1] < x[i]) {
            D = (uint32_t)(x[i] - x[i + 1]);
            if (D <= (uint32_t)(xmax - x[i]))
                d[i + 1] = 2 * D - 1;
            else
                d[i + 1] = xmax - x[i + 1];
        } else {
            D = (uint32_t)(x[i + 1] - x[i]);
            if (D <= (uint32_t)(x[i] - xmin))
                d[i + 1] = 2 * D;
            else
                d[i + 1] = x[i + 1] - xmin;
        }
    }
    state->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
}